

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O2

char * on_fire(permonst *mptr,attack *mattk)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = monsndx(mptr);
  pcVar2 = "already on fire";
  switch(iVar1) {
  case 0x6e:
  case 0x72:
switchD_001e24c8_caseD_a2:
    pcVar2 = "boiling";
    break;
  case 0x70:
switchD_001e24af_caseD_70:
    return "melting";
  case 0x73:
    break;
  default:
    switch(iVar1) {
    case 0x9f:
    case 0xa1:
      break;
    case 0xa0:
      goto switchD_001e24c8_caseD_a0;
    case 0xa2:
      goto switchD_001e24c8_caseD_a2;
    default:
      if (1 < iVar1 - 0x107U) {
        if (iVar1 == 0x20) {
          return pcVar2;
        }
        if (iVar1 != 0x103) {
          if (iVar1 != 0x109) {
            if (iVar1 == 0x157) {
              return pcVar2;
            }
            if (mattk->aatyp != '\a') {
              return "on fire";
            }
            return "being roasted";
          }
          goto switchD_001e24af_caseD_70;
        }
      }
    }
  case 0x6f:
  case 0x71:
    pcVar2 = "heating up";
  }
switchD_001e24c8_caseD_a0:
  return pcVar2;
}

Assistant:

const char *on_fire(const struct permonst *mptr, const struct attack *mattk)
{
    const char *what;

    switch (monsndx(mptr)) {
    case PM_FLAMING_SPHERE:
    case PM_FIRE_VORTEX:
    case PM_FIRE_ELEMENTAL:
    case PM_SALAMANDER:
	what = "already on fire";
	break;
    case PM_WATER_ELEMENTAL:
    case PM_FOG_CLOUD:
    case PM_STEAM_VORTEX:
	what = "boiling";
	break;
    case PM_ICE_VORTEX:
    case PM_GLASS_GOLEM:
	what = "melting";
	break;
    case PM_STONE_GOLEM:
    case PM_CLAY_GOLEM:
    case PM_GOLD_GOLEM:
    case PM_AIR_ELEMENTAL:
    case PM_EARTH_ELEMENTAL:
    case PM_DUST_VORTEX:
    case PM_ENERGY_VORTEX:
	what = "heating up";
	break;
    default:
	what = (mattk->aatyp == AT_HUGS) ? "being roasted" : "on fire";
	break;
    }
    return what;
}